

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_inet_resolve_host(ngx_pool_t *pool,ngx_url_t *u)

{
  uint uVar1;
  uint uVar2;
  socklen_t socklen;
  uint uVar3;
  uint uVar4;
  socklen_t socklen_00;
  uint16_t uVar5;
  int iVar6;
  u_char *puVar7;
  ngx_addr_t *pnVar8;
  sockaddr *psVar9;
  size_t sVar10;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  addrinfo *rp;
  addrinfo *res;
  addrinfo hints;
  ngx_uint_t i;
  in_port_t port;
  size_t len;
  u_char *host;
  u_char *p;
  ngx_url_t *u_local;
  ngx_pool_t *pool_local;
  
  uVar5 = htons(u->port);
  puVar7 = (u_char *)ngx_alloc((u->host).len + 1,pool->log);
  if (puVar7 != (u_char *)0x0) {
    ngx_cpystrn(puVar7,(u->host).data,(u->host).len + 1);
    memset(&res,0,0x30);
    res._4_4_ = 0;
    hints.ai_flags = 1;
    res._0_4_ = 0x20;
    iVar6 = getaddrinfo((char *)puVar7,(char *)0x0,(addrinfo *)&res,(addrinfo **)&rp);
    if (iVar6 == 0) {
      free(puVar7);
      hints.ai_next = (addrinfo *)0x0;
      for (sin = (sockaddr_in *)rp; sin != (sockaddr_in *)0x0;
          sin = *(sockaddr_in **)sin[2].sin_zero) {
        if (((sin->sin_addr).s_addr | 8) == 10) {
          hints.ai_next = (addrinfo *)((long)&(hints.ai_next)->ai_flags + 1);
        }
      }
      if (hints.ai_next == (addrinfo *)0x0) {
        u->err = "host not found";
      }
      else {
        pnVar8 = (ngx_addr_t *)ngx_pcalloc(pool,(long)hints.ai_next << 5);
        u->addrs = pnVar8;
        if (u->addrs != (ngx_addr_t *)0x0) {
          u->naddrs = (ngx_uint_t)hints.ai_next;
          hints.ai_next = (addrinfo *)0x0;
          for (sin = (sockaddr_in *)rp; sin != (sockaddr_in *)0x0;
              sin = *(sockaddr_in **)sin[2].sin_zero) {
            if ((sin->sin_addr).s_addr == 2) {
              uVar1._0_2_ = sin[1].sin_family;
              uVar1._2_2_ = sin[1].sin_port;
              psVar9 = (sockaddr *)ngx_pcalloc(pool,(ulong)uVar1);
              if (psVar9 == (sockaddr *)0x0) goto LAB_00122184;
              uVar2._0_2_ = sin[1].sin_family;
              uVar2._2_2_ = sin[1].sin_port;
              memcpy(psVar9,*(void **)sin[1].sin_zero,(ulong)uVar2);
              *(uint16_t *)psVar9->sa_data = uVar5;
              u->addrs[(long)hints.ai_next].sockaddr = psVar9;
              u->addrs[(long)hints.ai_next].socklen = *(socklen_t *)(sin + 1);
              puVar7 = (u_char *)ngx_pnalloc(pool,0x15);
              if (puVar7 == (u_char *)0x0) goto LAB_00122184;
              socklen._0_2_ = sin[1].sin_family;
              socklen._2_2_ = sin[1].sin_port;
              sVar10 = ngx_sock_ntop(psVar9,socklen,puVar7,0x15,1);
              u->addrs[(long)hints.ai_next].name.len = sVar10;
              u->addrs[(long)hints.ai_next].name.data = puVar7;
              hints.ai_next = (addrinfo *)((long)&(hints.ai_next)->ai_flags + 1);
            }
          }
          sin = (sockaddr_in *)rp;
          do {
            if (sin == (sockaddr_in *)0x0) {
              freeaddrinfo((addrinfo *)rp);
              return 0;
            }
            if ((sin->sin_addr).s_addr == 10) {
              uVar3._0_2_ = sin[1].sin_family;
              uVar3._2_2_ = sin[1].sin_port;
              psVar9 = (sockaddr *)ngx_pcalloc(pool,(ulong)uVar3);
              if (psVar9 == (sockaddr *)0x0) break;
              uVar4._0_2_ = sin[1].sin_family;
              uVar4._2_2_ = sin[1].sin_port;
              memcpy(psVar9,*(void **)sin[1].sin_zero,(ulong)uVar4);
              *(uint16_t *)psVar9->sa_data = uVar5;
              u->addrs[(long)hints.ai_next].sockaddr = psVar9;
              u->addrs[(long)hints.ai_next].socklen = *(socklen_t *)(sin + 1);
              puVar7 = (u_char *)ngx_pnalloc(pool,0x35);
              if (puVar7 == (u_char *)0x0) break;
              socklen_00._0_2_ = sin[1].sin_family;
              socklen_00._2_2_ = sin[1].sin_port;
              sVar10 = ngx_sock_ntop(psVar9,socklen_00,puVar7,0x35,1);
              u->addrs[(long)hints.ai_next].name.len = sVar10;
              u->addrs[(long)hints.ai_next].name.data = puVar7;
              hints.ai_next = (addrinfo *)((long)&(hints.ai_next)->ai_flags + 1);
            }
            sin = *(sockaddr_in **)sin[2].sin_zero;
          } while( true );
        }
      }
LAB_00122184:
      freeaddrinfo((addrinfo *)rp);
    }
    else {
      u->err = "host not found";
      free(puVar7);
    }
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_inet_resolve_host(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char               *p, *host;
    size_t                len;
    in_port_t             port;
    ngx_uint_t            i;
    struct addrinfo       hints, *res, *rp;
    struct sockaddr_in   *sin;
    struct sockaddr_in6  *sin6;

    port = htons(u->port);

    host = ngx_alloc(u->host.len + 1, pool->log);
    if (host == NULL) {
        return NGX_ERROR;
    }

    (void) ngx_cpystrn(host, u->host.data, u->host.len + 1);

    ngx_memzero(&hints, sizeof(struct addrinfo));
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
#ifdef AI_ADDRCONFIG
    hints.ai_flags = AI_ADDRCONFIG;
#endif

    if (getaddrinfo((char *) host, NULL, &hints, &res) != 0) {
        u->err = "host not found";
        ngx_free(host);
        return NGX_ERROR;
    }

    ngx_free(host);

    for (i = 0, rp = res; rp != NULL; rp = rp->ai_next) {

        switch (rp->ai_family) {

        case AF_INET:
        case AF_INET6:
            break;

        default:
            continue;
        }

        i++;
    }

    if (i == 0) {
        u->err = "host not found";
        goto failed;
    }

    /* MP: ngx_shared_palloc() */

    u->addrs = ngx_pcalloc(pool, i * sizeof(ngx_addr_t));
    if (u->addrs == NULL) {
        goto failed;
    }

    u->naddrs = i;

    i = 0;

    /* AF_INET addresses first */

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET) {
            continue;
        }

        sin = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin == NULL) {
            goto failed;
        }

        ngx_memcpy(sin, rp->ai_addr, rp->ai_addrlen);

        sin->sin_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET_ADDRSTRLEN + sizeof(":65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin, rp->ai_addrlen, p, len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    for (rp = res; rp != NULL; rp = rp->ai_next) {

        if (rp->ai_family != AF_INET6) {
            continue;
        }

        sin6 = ngx_pcalloc(pool, rp->ai_addrlen);
        if (sin6 == NULL) {
            goto failed;
        }

        ngx_memcpy(sin6, rp->ai_addr, rp->ai_addrlen);

        sin6->sin6_port = port;

        u->addrs[i].sockaddr = (struct sockaddr *) sin6;
        u->addrs[i].socklen = rp->ai_addrlen;

        len = NGX_INET6_ADDRSTRLEN + sizeof("[]:65535") - 1;

        p = ngx_pnalloc(pool, len);
        if (p == NULL) {
            goto failed;
        }

        len = ngx_sock_ntop((struct sockaddr *) sin6, rp->ai_addrlen, p,
                            len, 1);

        u->addrs[i].name.len = len;
        u->addrs[i].name.data = p;

        i++;
    }

    freeaddrinfo(res);
    return NGX_OK;

failed:

    freeaddrinfo(res);
    return NGX_ERROR;
}